

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedData(CFIReaderImpl *this,size_t index,size_t len)

{
  bool bVar1;
  DeadlyImportError *pDVar2;
  size_type sVar3;
  reference pvVar4;
  pointer ppVar5;
  pointer pFVar6;
  FIDecoder *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<const_Assimp::FIValue> sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Self local_f8;
  _Self local_f0;
  iterator it;
  string uri;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_7d;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 *local_30;
  FIDecoder *decoder;
  size_t len_local;
  size_t index_local;
  CFIReaderImpl *this_local;
  
  len_local = len;
  index_local = index;
  this_local = this;
  if (len < 0x20) {
    local_30 = *(undefined8 **)(defaultDecoder + len * 8);
    if (local_30 == (undefined8 *)0x0) {
      local_7d = 1;
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_70,len_local);
      std::operator+(&local_50,"Invalid encoding algorithm index ",&local_70);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_50);
      local_7d = 0;
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    (**(code **)*local_30)(this,local_30,*(undefined8 *)(index + 0x10),in_RCX);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    decoder = in_RCX;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(index + 0x40));
    if (sVar3 <= len - 0x20) {
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_c0,len_local);
      std::operator+(&local_a0,"Invalid encoding algorithm index ",&local_c0);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_a0);
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(index + 0x40),len_local - 0x20);
    std::__cxx11::string::string((string *)&it,(string *)pvVar4);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
                 *)(index + 0x1d0),(key_type *)&it);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
                *)(index + 0x1d0));
    bVar1 = std::operator==(&local_f0,&local_f8);
    if (bVar1) {
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_118,"Unsupported encoding algorithm ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_118);
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>
             ::operator->(&local_f0);
    pFVar6 = std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>::operator->
                       (&ppVar5->second);
    (*(code *)**(undefined8 **)pFVar6)(this,pFVar6,*(undefined8 *)(index + 0x10),decoder);
    std::__cxx11::string::~string((string *)&it);
    _Var7._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedData(size_t index, size_t len) {
        if (index < 32) {
            FIDecoder *decoder = defaultDecoder[index];
            if (!decoder) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            return decoder->decode(dataP, len);
        }
        else {
            if (index - 32 >= vocabulary.encodingAlgorithmTable.size()) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            std::string uri = vocabulary.encodingAlgorithmTable[index - 32];
            auto it = decoderMap.find(uri);
            if (it == decoderMap.end()) {
                throw DeadlyImportError("Unsupported encoding algorithm " + uri);
            }
            else {
                return it->second->decode(dataP, len);
            }
        }
    }